

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O2

void reverse_chars(string *from,string *to)

{
  uint uVar1;
  long *plVar2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __tmp;
  pointer pcVar3;
  char ch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  _Vector_base<char,_std::allocator<char>_> local_448;
  ofstream out_file;
  byte abStack_410 [480];
  ifstream in_file;
  uint auStack_210 [122];
  
  std::ifstream::ifstream(&in_file,(string *)from,_S_in);
  if ((*(byte *)((long)auStack_210 + *(long *)(_in_file + -0x18)) & 5) != 0) {
    file_open_err(from,in);
  }
  std::ofstream::ofstream(&out_file,(string *)to,_S_out);
  if ((abStack_410[*(long *)(_out_file + -0x18)] & 5) != 0) {
    file_open_err(to,out);
  }
  std::ios::exceptions((int)&ch + (int)*(undefined8 *)(_in_file + -0x18) + 600);
  std::ios::exceptions((int)&ch + (int)*(undefined8 *)(_out_file + -0x18) + 0x58);
  local_448._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ch = '\0';
  while( true ) {
    plVar2 = (long *)std::istream::get((char *)&in_file);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)&local_448,&ch);
  }
  uVar1 = *(uint *)((long)auStack_210 + *(long *)(_in_file + -0x18));
  if ((char)((uVar1 & 2) >> 1) == '\0' && (uVar1 & 5) != 0) {
    std::operator+(&local_468,"An error occurred while reading data from file \'",from);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ch,
                   &local_468,"\'.");
    error((string *)&ch);
    std::__cxx11::string::~string((string *)&ch);
    std::__cxx11::string::~string((string *)&local_468);
  }
  for (pcVar3 = local_448._M_impl.super__Vector_impl_data._M_finish;
      pcVar3 != local_448._M_impl.super__Vector_impl_data._M_start; pcVar3 = pcVar3 + -1) {
    std::operator<<((ostream *)&out_file,pcVar3[-1]);
  }
  if ((abStack_410[*(long *)(_out_file + -0x18)] & 5) != 0) {
    std::operator+(&local_468,"An error occurred while writing data to file \'",to);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ch,
                   &local_468,"\'.");
    error((string *)&ch);
    std::__cxx11::string::~string((string *)&ch);
    std::__cxx11::string::~string((string *)&local_468);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_448);
  std::ofstream::~ofstream(&out_file);
  std::ifstream::~ifstream(&in_file);
  return;
}

Assistant:

void reverse_chars(const std::string& from, const std::string& to)
{
	std::ifstream in_file{ from };
	if (!in_file)
	{
		file_open_err(from, FileType::in);
	}
	std::ofstream out_file{ to };
	if (!out_file)
	{
		file_open_err(to, FileType::out);
	}
	in_file.exceptions(in_file.exceptions() | std::ios::badbit);
	out_file.exceptions(out_file.exceptions() | std::ios::badbit);
	auto chars = std::vector<char>();
	for (auto ch = char(); in_file.get(ch);)
	{
		chars.push_back(ch);
	}
	if (in_file.fail() && !in_file.eof())
	{
		error("An error occurred while reading data from file '" + from + "'.");
	}

	for (auto rit = chars.rbegin(); rit != chars.rend(); ++rit)
	{
		out_file << *rit;
	}
	if (out_file.fail())
	{
		error("An error occurred while writing data to file '" + to + "'.");
	}
}